

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O0

R_conflict1 scanPrefix(char *p,char *stop,int base)

{
  char cVar1;
  bool bVar2;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  R_conflict1 RVar3;
  char *x_or_b;
  int local_24;
  char *local_18;
  char *local_10;
  int local_8;
  
  local_24 = in_EDX;
  if ((in_RDI < in_RSI) && (bVar2 = QtMiscUtils::isAsciiDigit((int)*in_RDI), bVar2)) {
    if (*in_RDI == '0') {
      if (in_RDI + 1 < in_RSI) {
        cVar1 = in_RDI[1];
        local_18 = in_RDI;
        if (cVar1 == 'B') {
LAB_0014c85b:
          if (in_EDX == 0) {
            local_24 = 2;
          }
          if (local_24 == 2) {
            local_18 = in_RDI + 2;
          }
          local_10 = local_18;
          local_8 = local_24;
        }
        else {
          if (cVar1 != 'X') {
            if (cVar1 == 'b') goto LAB_0014c85b;
            if (cVar1 != 'x') goto LAB_0014c8cd;
          }
          if (in_EDX == 0) {
            local_24 = 0x10;
          }
          if (local_24 == 0x10) {
            local_18 = in_RDI + 2;
          }
          local_10 = local_18;
          local_8 = local_24;
        }
        goto LAB_0014c903;
      }
LAB_0014c8cd:
      if (in_EDX == 0) {
        local_24 = 8;
      }
    }
    else if (in_EDX == 0) {
      local_24 = 10;
    }
  }
  local_8 = local_24;
  local_10 = in_RDI;
LAB_0014c903:
  RVar3.base = local_8;
  RVar3.next = local_10;
  RVar3._12_4_ = 0;
  return RVar3;
}

Assistant:

static auto scanPrefix(const char *p, const char *stop, int base)
{
    struct R
    {
        const char *next;
        int base;
    };
    if (p < stop && isAsciiDigit(*p)) {
        if (*p == '0') {
            const char *x_or_b = p + 1;
            if (x_or_b < stop) {
                switch (*x_or_b) {
                case 'b':
                case 'B':
                    if (base == 0)
                        base = 2;
                    if (base == 2)
                        p += 2;
                    return R{p, base};
                case 'x':
                case 'X':
                    if (base == 0)
                        base = 16;
                    if (base == 16)
                        p += 2;
                    return R{p, base};
                }
            }
            if (base == 0)
                base = 8;
        } else if (base == 0) {
            base = 10;
        }
        Q_ASSERT(base);
    }
    return R{p, base};
}